

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_xswiftec_var(secp256k1_fe *x,secp256k1_fe *u,secp256k1_fe *t)

{
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_fe sStack_78;
  secp256k1_fe local_48;
  
  secp256k1_ellswift_xswiftec_frac_var(&local_48,&sStack_78,u,t);
  secp256k1_fe_inv_var(&sStack_78,&sStack_78);
  secp256k1_fe_mul(x,&local_48,&sStack_78);
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_var(secp256k1_fe *x, const secp256k1_fe *u, const secp256k1_fe *t) {
    secp256k1_fe xn, xd;
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, u, t);
    secp256k1_fe_inv_var(&xd, &xd);
    secp256k1_fe_mul(x, &xn, &xd);
}